

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_perform_user(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  pop3state pVar2;
  char *pcVar3;
  
  if ((data->state).aptr.user == (char *)0x0) {
    pVar2 = POP3_STOP;
  }
  else {
    pcVar3 = "";
    if (conn->user != (char *)0x0) {
      pcVar3 = conn->user;
    }
    CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",pcVar3);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pVar2 = POP3_USER;
  }
  (data->conn->proto).pop3c.state = pVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_perform_user(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we do not */
  if(!data->state.aptr.user) {
    pop3_state(data, POP3_STOP);

    return result;
  }

  /* Send the USER command */
  result = Curl_pp_sendf(data, &conn->proto.pop3c.pp, "USER %s",
                         conn->user ? conn->user : "");
  if(!result)
    pop3_state(data, POP3_USER);

  return result;
}